

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

KOption getdetails(Header *h,size_t totalsize,char **fmt,int *psize,int *ntoalign)

{
  uint uVar1;
  KOption KVar2;
  KOption KVar3;
  uint uVar4;
  uint uVar5;
  uint local_34;
  
  KVar2 = getoption(h,fmt,psize);
  local_34 = *psize;
  uVar4 = local_34;
  if (KVar2 == Kpaddalign) {
    if (**fmt != '\0') {
      KVar3 = getoption(h,fmt,(int *)&local_34);
      uVar4 = local_34;
      if (local_34 != 0 && KVar3 != Kchar) goto LAB_00148038;
    }
    uVar4 = local_34;
    luaL_argerror(h->L,1,"invalid next option for option \'X\'");
  }
LAB_00148038:
  uVar5 = 0;
  if (KVar2 != Kchar && 1 < (int)uVar4) {
    uVar1 = h->maxalign;
    if ((int)uVar4 < h->maxalign) {
      uVar1 = uVar4;
    }
    uVar5 = uVar1 - 1;
    if ((uVar1 & uVar5) != 0) {
      luaL_argerror(h->L,1,"format asks for alignment not power of 2");
    }
    uVar5 = uVar1 - ((uint)totalsize & uVar5) & uVar5;
  }
  *ntoalign = uVar5;
  return KVar2;
}

Assistant:

static KOption getdetails (Header *h, size_t totalsize,
                           const char **fmt, int *psize, int *ntoalign) {
  KOption opt = getoption(h, fmt, psize);
  int align = *psize;  /* usually, alignment follows size */
  if (opt == Kpaddalign) {  /* 'X' gets alignment from following option */
    if (**fmt == '\0' || getoption(h, fmt, &align) == Kchar || align == 0)
      luaL_argerror(h->L, 1, "invalid next option for option 'X'");
  }
  if (align <= 1 || opt == Kchar)  /* need no alignment? */
    *ntoalign = 0;
  else {
    if (align > h->maxalign)  /* enforce maximum alignment */
      align = h->maxalign;
    if (l_unlikely((align & (align - 1)) != 0))  /* not a power of 2? */
      luaL_argerror(h->L, 1, "format asks for alignment not power of 2");
    *ntoalign = (align - (int)(totalsize & (align - 1))) & (align - 1);
  }
  return opt;
}